

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

xmlSaveCtxtPtr xmlSaveToFd(int fd,char *encoding,int options)

{
  xmlSaveCtxtPtr ctxt;
  xmlOutputBufferPtr pxVar1;
  
  ctxt = xmlNewSaveCtxt(encoding,options);
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    pxVar1 = xmlOutputBufferCreateFd(fd,ctxt->handler);
    ctxt->buf = pxVar1;
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      return ctxt;
    }
    xmlCharEncCloseFunc(ctxt->handler);
    xmlFreeSaveCtxt(ctxt);
  }
  return (xmlSaveCtxtPtr)0x0;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToFd(int fd, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateFd(fd, ret->handler);
    if (ret->buf == NULL) {
        xmlCharEncCloseFunc(ret->handler);
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}